

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmmulticast.c
# Opt level: O3

int libcmmulticast_LTX_writev_func
              (CMtrans_services_conflict svc,mcast_conn_data_ptr mcd,iovec *iov,int iovcnt,
              attr_list attrs)

{
  ushort uVar1;
  ushort *puVar2;
  code *pcVar3;
  long lVar4;
  short *psVar5;
  char *__s1;
  uint uVar6;
  int iVar7;
  int iVar8;
  in_addr_t iVar9;
  ssize_t sVar10;
  hostent *phVar11;
  char **ppcVar12;
  void *__ptr;
  long *plVar13;
  void *pvVar14;
  msghdr *__message;
  char *pcVar15;
  ulong uVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  uint *__cp;
  uint nl;
  sockaddr_in addr;
  long *plStack_208;
  int aiStack_200 [2];
  void *pvStack_1f8;
  char acStack_1f0 [48];
  char acStack_1c0 [264];
  ulong uStack_b8;
  iovec *piStack_b0;
  undefined4 *puStack_a8;
  mcast_conn_data_ptr pmStack_a0;
  CMtrans_services_conflict pCStack_98;
  code *pcStack_90;
  socklen_t local_7c;
  undefined4 local_78;
  in_addr_t iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  msghdr local_68;
  
  uVar18 = mcd->output_fd;
  local_78._0_2_ = (mcd->output_addr).sin_family;
  local_78._2_2_ = (mcd->output_addr).sin_port;
  iStack_74 = (mcd->output_addr).sin_addr.s_addr;
  uStack_70 = *(undefined4 *)(mcd->output_addr).sin_zero;
  uStack_6c = *(undefined4 *)((mcd->output_addr).sin_zero + 4);
  pcStack_90 = (code *)0x101dda;
  (*svc->trace_out)(mcd->mtd->cm,"CMMcast writev of %d vectors on fd %d",(ulong)(uint)iovcnt,
                    (ulong)uVar18);
  __message = &local_68;
  local_68.msg_control = (void *)0x0;
  local_68.msg_controllen = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  local_68.msg_namelen = 0x10;
  local_68._12_4_ = 0;
  local_68.msg_iovlen = (size_t)iovcnt;
  uVar16 = (ulong)uVar18;
  pcStack_90 = (code *)0x101e0c;
  local_68.msg_name = &local_78;
  local_68.msg_iov = (iovec *)iov;
  sVar10 = sendmsg(uVar18,__message,0);
  if (-1 < sVar10) {
    if ((mcd->my_addr).sin_port == 0) {
      pcStack_90 = (code *)0x101e27;
      uVar6 = get_self_ip_addr((void *)0x0,svc);
      local_7c = 0x10;
      pcStack_90 = (code *)0x101e3f;
      iVar7 = getsockname(uVar18,(sockaddr *)&mcd->my_addr,&local_7c);
      if (iVar7 != 0) {
        pcStack_90 = (code *)0x101e67;
        perror("getsockname");
      }
      (mcd->my_addr).sin_addr.s_addr =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    }
    return iovcnt;
  }
  pcStack_90 = get_self_ip_addr;
  libcmmulticast_LTX_writev_func_cold_1();
  plStack_208 = (long *)0x0;
  uStack_b8 = (ulong)(uint)iovcnt;
  piStack_b0 = iov;
  puStack_a8 = &local_78;
  pmStack_a0 = mcd;
  pCStack_98 = svc;
  pcStack_90 = (code *)(ulong)uVar18;
  iVar7 = getifaddrs(&plStack_208);
  if (iVar7 == 0) {
    if (plStack_208 != (long *)0x0) {
      plVar13 = plStack_208;
      do {
        puVar2 = (ushort *)plVar13[3];
        if (puVar2 != (ushort *)0x0) {
          uVar1 = *puVar2;
          if ((uVar1 & 0xfff7) == 2 && __message != (msghdr *)0x0) {
            pcVar3 = *(code **)&__message->msg_flags;
            lVar4 = plVar13[1];
            pcVar15 = inet_ntop((uint)uVar1,puVar2 + (ulong)(uVar1 != 2) * 2 + 2,acStack_1f0,0x2e);
            (*pcVar3)(uVar16,"CM<transport> IP possibility -> %s : %s",lVar4,pcVar15);
          }
        }
        plVar13 = (long *)*plVar13;
      } while (plVar13 != (long *)0x0);
    }
    pcVar15 = getenv("CM_INTERFACE");
    plVar17 = plStack_208;
    plVar13 = plStack_208;
    if (pcVar15 != (char *)0x0) {
      for (; plVar13 != (long *)0x0; plVar13 = (long *)*plVar13) {
        psVar5 = (short *)plVar13[3];
        if ((psVar5 != (short *)0x0) && (*psVar5 == 2)) {
          __s1 = (char *)plVar13[1];
          iVar7 = strcmp(__s1,pcVar15);
          if (iVar7 == 0) {
            __cp = (uint *)(psVar5 + 2);
            if (__message != (msghdr *)0x0) {
              pcVar3 = *(code **)&__message->msg_flags;
              pcVar15 = inet_ntop(2,__cp,acStack_1f0,0x2e);
              (*pcVar3)(uVar16,"CM<transport> Interface specified, returning ->%s : %s",__s1,pcVar15
                       );
              plVar17 = plStack_208;
            }
            goto LAB_00102323;
          }
        }
      }
      printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
             ,pcVar15);
    }
    gethostname(acStack_1c0,0x100);
    phVar11 = gethostbyname(acStack_1c0);
    if (phVar11 != (hostent *)0x0) {
      ppcVar12 = phVar11->h_addr_list;
      __cp = (uint *)*ppcVar12;
      while (__cp != (uint *)0x0) {
        ppcVar12 = ppcVar12 + 1;
        uVar18 = *__cp;
        if ((char)uVar18 != '\x7f') {
          plVar17 = plStack_208;
          if (__message != (msghdr *)0x0) {
            (**(code **)&__message->msg_flags)
                      (uVar16,"CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
                       uVar18 & 0xff,uVar18 >> 8 & 0xff,uVar18 >> 0x10 & 0xff,uVar18 >> 0x18);
            plVar17 = plStack_208;
          }
LAB_00102323:
          freeifaddrs(plVar17);
          goto LAB_00102328;
        }
        __cp = (uint *)*ppcVar12;
      }
    }
    plVar13 = plStack_208;
    if (plStack_208 == (long *)0x0) goto LAB_00101eb3;
    do {
      psVar5 = (short *)plVar13[3];
      if (((psVar5 != (short *)0x0) && (*psVar5 == 2)) && ((*(byte *)(plVar13 + 2) & 8) == 0)) {
        if (__message != (msghdr *)0x0) {
          pcVar3 = *(code **)&__message->msg_flags;
          lVar4 = plVar13[1];
          pcVar15 = inet_ntop(2,psVar5 + 2,acStack_1f0,0x2e);
          (*pcVar3)(uVar16,"CM<transport> get_self_ip_addr returning first avail -> %s : %s",lVar4,
                    pcVar15);
        }
        uVar18 = *(uint *)(psVar5 + 2);
        freeifaddrs(plStack_208);
        return uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      }
      plVar13 = (long *)*plVar13;
    } while (plVar13 != (long *)0x0);
  }
  if (plStack_208 != (long *)0x0) {
    freeifaddrs(plStack_208);
  }
LAB_00101eb3:
  gethostname(acStack_1c0,0x100);
  phVar11 = gethostbyname(acStack_1c0);
  if (phVar11 != (hostent *)0x0) {
    ppcVar12 = phVar11->h_addr_list;
    __cp = (uint *)*ppcVar12;
    while (__cp != (uint *)0x0) {
      ppcVar12 = ppcVar12 + 1;
      uVar18 = *__cp;
      uVar6 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      if (uVar18 << 0x18 != 0x7f000000) {
        if (__message == (msghdr *)0x0) {
          return uVar6;
        }
        (**(code **)&__message->msg_flags)
                  (uVar16,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",uVar6,
                   uVar18 & 0xff,uVar18 >> 8 & 0xff,uVar18 >> 0x10 & 0xff,uVar18 >> 0x18);
LAB_00102328:
        uVar18 = *__cp;
        return uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
      }
      __cp = (uint *)*ppcVar12;
    }
  }
  iVar7 = socket(2,2,0);
  aiStack_200[0] = 0xa00;
  __ptr = malloc(0xa00);
  pvStack_1f8 = __ptr;
  iVar8 = ioctl(iVar7,0x8912,aiStack_200);
  iVar9 = 0;
  if ((-1 < iVar8) &&
     (uVar19 = (ulong)(long)aiStack_200[0] / 0x28, pvVar14 = pvStack_1f8, iVar9 = 0,
     (int)uVar19 != 0)) {
    do {
      ioctl(iVar7,0x8913,pvVar14);
      uVar1 = *(ushort *)((long)pvVar14 + 0x10);
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 1) == 0) {
          pcVar15 = "CM<transport> - Get self IP addr %lx, rejected, not UP";
          goto LAB_00101faf;
        }
        if ((uVar1 & 0x40) == 0) {
          pcVar15 = "CM<transport> - Get self IP addr %lx, rejected, not RUNNING";
          goto LAB_00101faf;
        }
        uVar18 = *(uint *)((long)pvVar14 + 0x14);
        if ((uVar18 != 0) && (uVar18 != 0x7f000001)) {
          iVar9 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                  uVar18 << 0x18;
          if (__message != (msghdr *)0x0) {
            (**(code **)&__message->msg_flags)
                      (uVar16,"CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",iVar9,
                       uVar18 & 0xff,uVar18 >> 8 & 0xff,uVar18 >> 0x10 & 0xff,uVar18 >> 0x18);
          }
          goto LAB_0010218d;
        }
      }
      else {
        pcVar15 = "CM<transport> - Get self IP addr %lx, rejected, loopback";
LAB_00101faf:
        if (__message != (msghdr *)0x0) {
          uVar18 = *(uint *)((long)pvVar14 + 0x14);
          (**(code **)&__message->msg_flags)
                    (uVar16,pcVar15,
                     uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                     uVar18 << 0x18);
        }
      }
      uVar18 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar18;
      pvVar14 = (void *)((long)pvVar14 + 0x28);
    } while (uVar18 != 0);
    iVar9 = 0;
  }
LAB_0010218d:
  close(iVar7);
  free(__ptr);
  if (iVar9 == 0) {
    pcVar15 = getenv("CM_LAST_RESORT_IP_ADDR");
    if (__message == (msghdr *)0x0) {
      if (pcVar15 == (char *)0x0) {
        return 0;
      }
    }
    else {
      (**(code **)&__message->msg_flags)(uVar16,"CM<transport> - Get self IP addr at last resort");
      if (pcVar15 == (char *)0x0) {
        return 0;
      }
      (**(code **)&__message->msg_flags)
                (uVar16,"CM<transport> - Translating last resort %s",pcVar15);
    }
    iVar9 = inet_addr(pcVar15);
  }
  return iVar9;
}

Assistant:

extern int
libcmmulticast_LTX_writev_func(CMtrans_services svc, mcast_conn_data_ptr mcd, struct iovec *iov, int iovcnt, attr_list attrs)
{
    SOCKET fd = mcd->output_fd;
#ifndef _MSC_VER
    // no real equivalent on windows
    struct sockaddr_in addr = mcd->output_addr;
    struct msghdr msg;
    svc->trace_out(mcd->mtd->cm, "CMMcast writev of %d vectors on fd %d",
		   iovcnt, fd);
    memset(&msg, 0, sizeof(msg));
    msg.msg_name = (void*)&addr;
    msg.msg_namelen = sizeof(addr);
    msg.msg_iov = &iov[0];
    msg.msg_iovlen = iovcnt;
    if (sendmsg(fd, &msg, 0) < 0) {
	perror("write sendmsg");
	exit(1);
    }
#endif
    if (mcd->my_addr.sin_port == 0) {
	unsigned int nl;
	int IP = get_self_ip_addr(NULL, svc);
	nl = sizeof(struct sockaddr_in);
	if (getsockname(fd, (struct sockaddr *) &mcd->my_addr, &nl) != 0)
	    perror("getsockname");


	mcd->my_addr.sin_addr.s_addr = htonl(IP);
    }
    return iovcnt;
}